

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throttle.cpp
# Opt level: O1

void throttle_copy(Metric *src,Metric *dst,Duration cooldown_period,Duration chunk_interval)

{
  size_t sVar2;
  ostream *poVar3;
  TimePoint begin;
  pointer pTVar5;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar6;
  ulong uVar7;
  pair<hta::Clock::time_point,_hta::Clock::time_point> pVar8;
  TimeValue tv;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> data;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> local_98;
  long local_80;
  double local_78;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_70;
  Metric *local_68;
  rep local_60;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_58;
  Metric *local_50;
  rep local_48;
  pointer local_40;
  Value local_38;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar1;
  duration dVar4;
  
  local_60 = chunk_interval.__r;
  local_50 = dst;
  local_48 = cooldown_period.__r;
  pVar8 = hta::Metric::range(src);
  dVar4.__r = (rep)pVar8.second.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r;
  tVar1.__d.__r =
       (duration)
       pVar8.first.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_68 = src;
  sVar2 = hta::Metric::count(src);
  local_70.__d.__r = (duration)(duration)dVar4.__r;
  if ((long)tVar1.__d.__r <= dVar4.__r) {
    local_78 = (double)(dVar4.__r - (long)tVar1.__d.__r);
    uVar7 = 0;
    tVar6.__d.__r = (duration)0;
    local_80 = (long)tVar1.__d.__r;
    do {
      local_70.__d.__r =
           (duration)
           pVar8.second.
           super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
           __d.__r;
      begin.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 )pVar8.first.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r;
      print_progress((double)((long)begin.
                                    super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    .__d.__r - (long)tVar1.__d.__r) / local_78);
      local_58.__d.__r =
           (duration)
           ((long)begin.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r + local_60);
      hta::Metric::retrieve(&local_98,local_68,begin,(TimePoint)local_58.__d.__r,(IntervalScope)0x1)
      ;
      local_40 = local_98.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      pTVar5 = local_98.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_98.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_98.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          uVar7 = uVar7 + 1;
          dVar4.__r = (pTVar5->time).
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      .__d.__r;
          local_38 = pTVar5->value;
          if ((sVar2 == uVar7) || ((uVar7 / 100000000) * 100000000 - uVar7 == 0)) {
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," / ",3);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          if ((long)tVar6.__d.__r < dVar4.__r) {
            if (local_48 + (long)tVar6.__d.__r < dVar4.__r) {
              tv.value = local_38;
              tv.time.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          )(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            )dVar4.__r;
              hta::Metric::insert(local_50,tv);
              tVar6.__d.__r = (duration)(duration)dVar4.__r;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Non-Monotonic time ",0x13);
            std::ostream::_M_insert<long>((long)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," at index ",10);
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
            std::ostream::put((char)poVar3);
            std::ostream::flush();
          }
          pTVar5 = pTVar5 + 1;
          tVar1.__d.__r = (duration)(duration)local_80;
        } while (pTVar5 != local_40);
      }
      if (local_98.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pVar8.second.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            local_70.__d.__r;
      pVar8.first.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            local_58.__d.__r;
    } while ((long)local_58.__d.__r <= (long)local_70.__d.__r);
  }
  printf("\r%3d%% [%.*s%*s]",100,0x3c,"||||||||||||||||||||||||||||||||||||||||||||||||||||||||||||"
         ,0,"");
  fflush(_stdout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"completed, read: ",0x11)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", written: ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void throttle_copy(hta::Metric& src, hta::Metric& dst, hta::Duration cooldown_period,
                   hta::Duration chunk_interval = hta::duration_cast(std::chrono::hours(30 * 24)))
{
    auto total_range = src.range();
    size_t read = 0, written = 0;
    auto count = src.count();
    hta::TimePoint previous_time;
    for (auto t0 = total_range.first; t0 <= total_range.second; t0 += chunk_interval)
    {
        print_progress(static_cast<double>((t0 - total_range.first).count()) /
                       (total_range.second - total_range.first).count());
        auto data = src.retrieve(t0, t0 + chunk_interval, { hta::Scope::closed, hta::Scope::open });
        for (auto tv : data)
        {
            read++;
            if (read % 100000000 == 0 || read == count)
            {
                std::cout << read << " / " << count << std::endl;
            }
            if (tv.time <= previous_time)
            {
                std::cerr << "Non-Monotonic time " << tv.time << " at index " << (read - 1)
                          << std::endl;
                continue;
            }
            if (previous_time + cooldown_period < tv.time)
            {
                previous_time = tv.time;
                dst.insert(tv);
                written++;
            }
        }
    }
    print_progress(1);
    std::cout << "completed, read: " << read << ", written: " << written << std::endl;
}